

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O2

string * rcg::ensureNewFileName(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  string suffix;
  string local_3d0 [32];
  ostringstream s;
  ifstream file;
  
  std::ifstream::ifstream(&file,(string *)name,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ifstream::close();
    suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
    suffix._M_string_length = 0;
    suffix.field_2._M_local_buf[0] = '\0';
    lVar2 = std::__cxx11::string::rfind((char)name,0x2e);
    if ((lVar2 != -1) && (name->_M_string_length - lVar2 < 5)) {
      std::__cxx11::string::substr((ulong)&s,(ulong)name);
      std::__cxx11::string::operator=((string *)&suffix,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::substr((ulong)&s,(ulong)name);
      std::__cxx11::string::operator=((string *)name,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
    }
    iVar4 = 1;
    do {
      if (99 < iVar4) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      poVar3 = std::operator<<((ostream *)&s,(string *)name);
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
      std::operator<<(poVar3,(string *)&suffix);
      std::__cxx11::stringbuf::str();
      std::ifstream::open((string *)&file,(_Ios_Openmode)local_3d0);
      std::__cxx11::string::~string(local_3d0);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)name,local_3d0);
        std::__cxx11::string::~string(local_3d0);
      }
      else {
        std::ifstream::close();
        iVar4 = iVar4 + 1;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    } while (cVar1 != '\0');
    std::__cxx11::string::~string((string *)&suffix);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::string ensureNewFileName(std::string name)
{
  // check if given name is already used

  std::ifstream file(name);

  if (file.is_open())
  {
    file.close();

    // split name in prefix and suffix

    std::string suffix;

    size_t i=name.rfind('.');
    if (i != name.npos && name.size()-i <= 4)
    {
      suffix=name.substr(i);
      name=name.substr(0, i);
    }

    // add number for finding name that is nor used

    int n=1;
    while (n < 100)
    {
      std::ostringstream s;
      s << name << "_" << n << suffix;

      file.open(s.str());
      if (!file.is_open())
      {
        name=s.str();
        break;
      }

      file.close();
      n++;
    }
  }

  return name;
}